

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

bam_hdr_t * sam_hdr_parse(int l_text,char *text)

{
  char cVar1;
  uint uVar2;
  khint32_t *pkVar3;
  int64_t *piVar4;
  long lVar5;
  kh_s2i_t *pkVar6;
  int iVar7;
  khint_t kVar8;
  char *pcVar9;
  bam_hdr_t *pbVar10;
  uint32_t *puVar11;
  char **ppcVar12;
  char *__s1;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  size_t __n;
  char *pcVar17;
  int absent;
  char *local_48;
  int local_3c;
  kh_s2i_t *local_38;
  
  local_38 = kh_init_s2i();
  cVar1 = *text;
  while (cVar1 != '\0') {
    iVar7 = strncmp(text,"@SQ",3);
    if (iVar7 == 0) {
      __s1 = text + 4;
      uVar15 = 0xffffffff;
      pcVar9 = (kh_cstr_t)0x0;
      do {
        local_48 = __s1;
        iVar7 = strncmp(__s1,"SN:",3);
        if (iVar7 == 0) {
          pcVar17 = __s1 + 2;
          __n = 0xffffffffffffffff;
          do {
            sVar16 = __n;
            pcVar9 = pcVar17 + 1;
            pcVar17 = pcVar17 + 1;
            __n = sVar16 + 1;
          } while (1 < (byte)(*pcVar9 - 9U));
          local_48 = __s1 + 3;
          pcVar9 = (char *)calloc(sVar16 + 2,1);
          strncpy(pcVar9,__s1 + 3,__n);
        }
        else {
          iVar7 = strncmp(__s1,"LN:",3);
          pcVar17 = local_48;
          if (iVar7 == 0) {
            uVar15 = strtol(__s1 + 3,&local_48,10);
            pcVar17 = local_48;
          }
        }
        do {
          text = pcVar17;
          pkVar6 = local_38;
          __s1 = text + 1;
          pcVar17 = __s1;
        } while (1 < (byte)(*text - 9U));
      } while (*text != '\n');
      local_48 = text;
      if ((pcVar9 != (kh_cstr_t)0x0) && (-1 < (int)uVar15)) {
        kVar8 = kh_put_s2i(local_38,pcVar9,&local_3c);
        if (local_3c == 0) {
          if (1 < hts_verbose) {
            fprintf(_stderr,"[W::%s] duplicated sequence \'%s\'\n","sam_hdr_parse",pcVar9);
          }
          free(pcVar9);
        }
        else {
          pkVar6->vals[kVar8] = uVar15 & 0xffffffff | (ulong)(pkVar6->size - 1) << 0x20;
        }
      }
    }
    do {
      cVar1 = *text;
      text = text + 1;
    } while (cVar1 != '\n');
    cVar1 = *text;
  }
  pbVar10 = (bam_hdr_t *)calloc(1,0x38);
  pkVar6 = local_38;
  pbVar10->sdict = local_38;
  kVar8 = local_38->size;
  pbVar10->n_targets = kVar8;
  puVar11 = (uint32_t *)malloc((long)(int)kVar8 * 4);
  pbVar10->target_len = puVar11;
  ppcVar12 = (char **)malloc((long)(int)kVar8 << 3);
  pbVar10->target_name = ppcVar12;
  uVar2 = pkVar6->n_buckets;
  if ((ulong)uVar2 != 0) {
    pkVar3 = pkVar6->flags;
    bVar13 = 0;
    uVar15 = 0;
    do {
      if ((pkVar3[uVar15 >> 4 & 0xfffffff] >> (bVar13 & 0x1e) & 3) == 0) {
        piVar4 = pkVar6->vals;
        lVar5 = piVar4[uVar15];
        lVar14 = lVar5 >> 0x20;
        ppcVar12[lVar14] = pkVar6->keys[uVar15];
        puVar11[lVar14] = (uint32_t)lVar5;
        piVar4[uVar15] = lVar14;
      }
      uVar15 = uVar15 + 1;
      bVar13 = bVar13 + 2;
    } while (uVar2 != uVar15);
  }
  return pbVar10;
}

Assistant:

bam_hdr_t *sam_hdr_parse(int l_text, const char *text)
{
    const char *q, *r, *p;
    khash_t(s2i) *d;
    d = kh_init(s2i);
    for (p = text; *p; ++p) {
        if (strncmp(p, "@SQ", 3) == 0) {
            char *sn = 0;
            int ln = -1;
            for (q = p + 4;; ++q) {
                if (strncmp(q, "SN:", 3) == 0) {
                    q += 3;
                    for (r = q; *r != '\t' && *r != '\n'; ++r);
                    sn = (char*)calloc(r - q + 1, 1);
                    strncpy(sn, q, r - q);
                    q = r;
                } else if (strncmp(q, "LN:", 3) == 0)
                    ln = strtol(q + 3, (char**)&q, 10);
                while (*q != '\t' && *q != '\n') ++q;
                if (*q == '\n') break;
            }
            p = q;
            if (sn && ln >= 0) {
                khint_t k;
                int absent;
                k = kh_put(s2i, d, sn, &absent);
                if (!absent) {
                    if (hts_verbose >= 2)
                        fprintf(stderr, "[W::%s] duplicated sequence '%s'\n", __func__, sn);
                    free(sn);
                } else kh_val(d, k) = (int64_t)(kh_size(d) - 1)<<32 | ln;
            }
        }
        while (*p != '\n') ++p;
    }
    return hdr_from_dict(d);
}